

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectation
          (ScriptValidator *this,Location *loc,TypeVector *result_types,ConstVector *expected,
          char *desc)

{
  pointer pCVar1;
  pointer pCVar2;
  size_t i;
  ulong uVar3;
  TypeVector actual_types;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  Type local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = (expected->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar2 = (expected->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    local_38 = pCVar2->type_;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_58,&local_38);
  }
  if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3 ==
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    for (uVar3 = 0;
        uVar3 < (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar3 = uVar3 + 1) {
      CheckTypeIndex(this,loc,local_58._M_impl.super__Vector_impl_data._M_start[uVar3],
                     (result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar3],"action",(Index)uVar3,"result")
      ;
    }
  }
  else {
    PrintError(this,loc,"expected %zd results, got %zd");
  }
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}